

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::PortSymbol::serializeTo(PortSymbol *this,ASTSerializer *serializer)

{
  Type *__n;
  Expression *__n_00;
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar1;
  Expression *init;
  Symbol *in_stack_00000058;
  ASTSerializer *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  PortSymbol *in_stack_00000080;
  PortSymbol *in_stack_00000168;
  ASTSerializer *in_stack_ffffffffffffff68;
  ASTSerializer *this_00;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff68);
  __n = getType(in_stack_00000168);
  ASTSerializer::write(this_00,local_20,local_18,(size_t)__n);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_ffffffffffffff68);
  sVar1 = ast::toString(In);
  local_40 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_30,local_28,local_40);
  if ((*(byte *)(in_RDI + 0x54) & 1) != 0) {
    in_stack_ffffffffffffff68 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    ASTSerializer::write
              (in_stack_ffffffffffffff68,local_50,local_48,(ulong)(*(byte *)(in_RDI + 0x54) & 1));
  }
  __n_00 = getInitializer(in_stack_00000080);
  if (__n_00 != (Expression *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff68);
    ASTSerializer::write(in_RSI,local_68,local_60,(size_t)__n_00);
  }
  if (*(long *)(in_RDI + 0x40) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff68);
    ASTSerializer::writeLink(in_stack_00000060,(string_view)in_stack_00000068,in_stack_00000058);
  }
  return;
}

Assistant:

void PortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("type", getType());
    serializer.write("direction", toString(direction));

    if (isNullPort)
        serializer.write("isNullPort", isNullPort);

    if (auto init = getInitializer())
        serializer.write("initializer", *init);

    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
}